

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::Tree::move(Tree *this,Tree *src,size_t node,size_t new_parent,size_t after)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  size_t in_RCX;
  Tree *in_RDX;
  Tree *in_RSI;
  long in_RDI;
  size_t in_R8;
  size_t dup;
  char msg_3 [36];
  char msg_2 [35];
  char msg_1 [29];
  char msg [31];
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  Location *in_stack_fffffffffffffe50;
  Location *this_00;
  Location local_138;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  undefined1 local_e8 [48];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  char local_98 [48];
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  char *local_50;
  char local_48 [24];
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  
  if (in_RSI == (Tree *)0x0) {
    builtin_strncpy(local_48,"check failed: (src != nu",0x18);
    in_stack_ffffffffffffffd0 = 0x74706c6c;
    in_stack_ffffffffffffffd4 = 0x2972;
    in_stack_ffffffffffffffd6 = 0;
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(local_48,0x1f,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe30 = uStack_68;
    in_stack_fffffffffffffe34 = uStack_64;
    in_stack_fffffffffffffe38 = local_60;
    in_stack_fffffffffffffe3c = uStack_5c;
    in_stack_fffffffffffffe40 = uStack_58;
    in_stack_fffffffffffffe44 = uStack_54;
    in_stack_fffffffffffffe48 = local_50;
  }
  if (in_RDX == (Tree *)0xffffffffffffffff) {
    builtin_strncpy(local_98,"check failed: (node != NONE)",0x1d);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(local_98,0x1d,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe30 = uStack_b8;
    in_stack_fffffffffffffe34 = uStack_b4;
    in_stack_fffffffffffffe38 = local_b0;
    in_stack_fffffffffffffe3c = uStack_ac;
    in_stack_fffffffffffffe40 = uStack_a8;
    in_stack_fffffffffffffe44 = uStack_a4;
    in_stack_fffffffffffffe48 = local_a0;
  }
  if (in_RCX == 0xffffffffffffffff) {
    memcpy(local_e8,"check failed: (new_parent != NONE)",0x23);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(local_e8,0x23,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe30 = uStack_108;
    in_stack_fffffffffffffe34 = uStack_104;
    in_stack_fffffffffffffe38 = local_100;
    in_stack_fffffffffffffe3c = uStack_fc;
    in_stack_fffffffffffffe40 = uStack_f8;
    in_stack_fffffffffffffe44 = uStack_f4;
    in_stack_fffffffffffffe48 = local_f0;
  }
  if (in_RCX == in_R8) {
    memcpy(&local_138,"check failed: (new_parent != after)",0x24);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    this_00 = &local_138;
    Location::Location(this_00,in_stack_fffffffffffffe48,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                       CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    (*pcVar1)(this_00,0x24,*(undefined8 *)(in_RDI + 0x40));
  }
  sVar4 = duplicate(in_RSI,in_RDX,in_RCX,in_R8,
                    CONCAT17(in_stack_ffffffffffffffd7,
                             CONCAT16(in_stack_ffffffffffffffd6,
                                      CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
                            ));
  remove(in_RSI,(char *)in_RDX);
  return sVar4;
}

Assistant:

size_t Tree::move(Tree *src, size_t node, size_t new_parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != after);

    size_t dup = duplicate(src, node, new_parent, after);
    src->remove(node);
    return dup;
}